

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectsContext.cpp
# Opt level: O0

string * __thiscall
ObjectsContext::MaybeEncryptString
          (string *__return_storage_ptr__,ObjectsContext *this,string *inString)

{
  bool bVar1;
  string *inString_local;
  ObjectsContext *this_local;
  
  bVar1 = IsEncrypting(this);
  if (bVar1) {
    EncryptionHelper::EncryptString(__return_storage_ptr__,this->mEncryptionHelper,inString);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)inString);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ObjectsContext::MaybeEncryptString(const std::string& inString) {
	if (IsEncrypting())
		return mEncryptionHelper->EncryptString(inString);
	else
		return inString;
}